

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall
Js::ParseableFunctionInfo::Copy(ParseableFunctionInfo *this,ParseableFunctionInfo *other)

{
  byte bVar1;
  ushort uVar2;
  Type TVar3;
  ScopeInfo *ptr;
  DeferredFunctionStub *ptr_00;
  PrintOffsets *ptr_01;
  RecyclerWeakReference<Js::JavascriptString> *weakRef;
  int *ptr_02;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  
  FunctionProxy::Copy(&this->super_FunctionProxy,&other->super_FunctionProxy);
  other->flags = this->flags;
  Memory::WriteBarrierPtr<Js::ScriptFunctionType>::operator=
            (&other->crossSiteDeferredFunctionType,&this->crossSiteDeferredFunctionType);
  Memory::WriteBarrierPtr<Js::ScriptFunctionType>::operator=
            (&other->crossSiteUndeferredFunctionType,&this->crossSiteUndeferredFunctionType);
  uVar7 = *(ushort *)&(this->super_FunctionProxy).field_0x45 & 4;
  uVar2 = *(ushort *)&(other->super_FunctionProxy).field_0x45;
  *(ushort *)&(other->super_FunctionProxy).field_0x45 = uVar2 & 0xfffb | uVar7;
  uVar8 = *(ushort *)&(this->super_FunctionProxy).field_0x45 & 8;
  *(ushort *)&(other->super_FunctionProxy).field_0x45 = uVar2 & 0xfff3 | uVar7 | uVar8;
  uVar9 = *(ushort *)&(this->super_FunctionProxy).field_0x45 & 0x100;
  *(ushort *)&(other->super_FunctionProxy).field_0x45 = uVar2 & 0xfef3 | uVar7 | uVar8 | uVar9;
  uVar10 = *(ushort *)&(this->super_FunctionProxy).field_0x45 & 0x1000;
  *(ushort *)&(other->super_FunctionProxy).field_0x45 =
       uVar2 & 0xeef3 | uVar7 | uVar8 | uVar9 | uVar10;
  uVar11 = *(ushort *)&(this->super_FunctionProxy).field_0x45 & 0x2000;
  *(ushort *)&(other->super_FunctionProxy).field_0x45 =
       uVar2 & 0xcef3 | uVar7 | uVar8 | uVar9 | uVar10 | uVar11;
  uVar12 = *(ushort *)&(this->super_FunctionProxy).field_0x45 & 0x4000;
  *(ushort *)&(other->super_FunctionProxy).field_0x45 =
       uVar2 & 0x8ef3 | uVar7 | uVar8 | uVar9 | uVar10 | uVar11 | uVar12;
  *(ushort *)&(other->super_FunctionProxy).field_0x45 =
       uVar2 & 0xef3 | uVar7 | uVar8 | uVar9 | uVar10 | uVar11 | uVar12 |
       *(ushort *)&(this->super_FunctionProxy).field_0x45 & 0x8000;
  bVar4 = (this->super_FunctionProxy).field_0x47 & 1;
  bVar1 = (other->super_FunctionProxy).field_0x47;
  (other->super_FunctionProxy).field_0x47 = bVar1 & 0xfe | bVar4;
  bVar5 = (this->super_FunctionProxy).field_0x47 & 2;
  (other->super_FunctionProxy).field_0x47 = bVar1 & 0xfc | bVar4 | bVar5;
  bVar6 = (this->super_FunctionProxy).field_0x47 & 4;
  (other->super_FunctionProxy).field_0x47 = bVar1 & 0xf8 | bVar4 | bVar5 | bVar6;
  (other->super_FunctionProxy).field_0x47 =
       bVar1 & 0xf0 | bVar4 | bVar5 | bVar6 | (this->super_FunctionProxy).field_0x47 & 8;
  other->m_inParamCount = this->m_inParamCount;
  other->m_grfscr = this->m_grfscr;
  ptr = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)20,Js::ScopeInfo*>
                  (&this->super_FunctionProxy);
  FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)20,Js::ScopeInfo*>
            (&other->super_FunctionProxy,ptr);
  ptr_00 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)0,DeferredFunctionStub*>
                     (&this->super_FunctionProxy);
  FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)0,DeferredFunctionStub*>
            (&other->super_FunctionProxy,ptr_00);
  ptr_01 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)28,Js::PrintOffsets*>
                     (&this->super_FunctionProxy);
  FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)28,Js::PrintOffsets*>
            (&other->super_FunctionProxy,ptr_01);
  (other->super_FunctionProxy).field_0x47 =
       (other->super_FunctionProxy).field_0x47 & 0x7f |
       (this->super_FunctionProxy).field_0x47 & 0x80;
  TVar3 = this->scopeObjectSize;
  other->deferredParseNextFunctionId = this->deferredParseNextFunctionId;
  other->scopeObjectSize = TVar3;
  TVar3 = this->paramScopeSlotArraySize;
  other->scopeSlotArraySize = this->scopeSlotArraySize;
  other->paramScopeSlotArraySize = TVar3;
  weakRef = FunctionProxy::
            GetAuxPtr<(Js::FunctionProxy::AuxPointerType)1,Memory::RecyclerWeakReference<Js::JavascriptString>*>
                      (&this->super_FunctionProxy);
  SetCachedSourceStringWeakRef(other,weakRef);
  uVar7 = *(ushort *)&(this->super_FunctionProxy).field_0x45 & 0x200;
  uVar2 = *(ushort *)&(other->super_FunctionProxy).field_0x45;
  *(ushort *)&(other->super_FunctionProxy).field_0x45 = uVar2 & 0xfdff | uVar7;
  *(ushort *)&(other->super_FunctionProxy).field_0x45 =
       uVar2 & 63999 | uVar7 | *(ushort *)&(this->super_FunctionProxy).field_0x45 & 0x400;
  ptr_02 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)13,int*>
                     (&this->super_FunctionProxy);
  if (ptr_02 != (int *)0x0) {
    TVar3 = this->paramScopeSlotArraySize;
    other->scopeSlotArraySize = this->scopeSlotArraySize;
    other->paramScopeSlotArraySize = TVar3;
    FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)13,int*>
              (&other->super_FunctionProxy,ptr_02);
  }
  other->m_sourceIndex = this->m_sourceIndex;
  TVar3 = this->m_cchLength;
  other->m_cchStartOffset = this->m_cchStartOffset;
  other->m_cchLength = TVar3;
  other->m_columnNumber = this->m_columnNumber;
  TVar3 = this->m_lineNumber;
  other->m_cbStartOffset = this->m_cbStartOffset;
  other->m_lineNumber = TVar3;
  other->m_cbLength = this->m_cbLength;
  CopyNestedArray(this,other);
  return;
}

Assistant:

void ParseableFunctionInfo::Copy(ParseableFunctionInfo * other)
    {
        __super::Copy(other);

#define CopyDeferParseField(field) other->field = this->field;
        CopyDeferParseField(flags);
        CopyDeferParseField(crossSiteDeferredFunctionType);
        CopyDeferParseField(crossSiteUndeferredFunctionType);
        CopyDeferParseField(m_isDeclaration);
        CopyDeferParseField(m_isAccessor);
        CopyDeferParseField(m_isStrictMode);
        CopyDeferParseField(m_isGlobalFunc);
        CopyDeferParseField(m_doBackendArgumentsOptimization);
        CopyDeferParseField(m_doScopeObjectCreation);
        CopyDeferParseField(m_usesArgumentsObject);
        CopyDeferParseField(m_isEval);
        CopyDeferParseField(m_isDynamicFunction);
        CopyDeferParseField(m_hasImplicitArgIns);
        CopyDeferParseField(m_dontInline);
        CopyDeferParseField(m_inParamCount);
        CopyDeferParseField(m_grfscr);
        other->SetScopeInfo(this->GetScopeInfo());
        other->SetDeferredStubs(this->GetDeferredStubs());
        other->SetPrintOffsets(this->GetPrintOffsets());
        CopyDeferParseField(m_utf8SourceHasBeenSet);
#if DBG
        CopyDeferParseField(deferredParseNextFunctionId);
        CopyDeferParseField(scopeObjectSize);
#endif
        CopyDeferParseField(scopeSlotArraySize);
        CopyDeferParseField(paramScopeSlotArraySize);
        other->SetCachedSourceStringWeakRef(this->GetCachedSourceStringWeakRef());
        CopyDeferParseField(m_isAsmjsMode);
        CopyDeferParseField(m_isAsmJsFunction);

        PropertyId * propertyIds = this->GetPropertyIdsForScopeSlotArray();
        if (propertyIds != nullptr)
        {
            other->SetPropertyIdsForScopeSlotArray(propertyIds, this->scopeSlotArraySize, this->paramScopeSlotArraySize);
        }

        CopyDeferParseField(m_sourceIndex);
        CopyDeferParseField(m_cchStartOffset);
        CopyDeferParseField(m_cchLength);
        CopyDeferParseField(m_lineNumber);
        CopyDeferParseField(m_columnNumber);
        CopyDeferParseField(m_cbStartOffset);
        CopyDeferParseField(m_cbLength);

        this->CopyNestedArray(other);
#undef CopyDeferParseField
   }